

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall Json::OurReader::readNumber(OurReader *this)

{
  char c;
  char *p;
  OurReader *this_local;
  
  c = '0';
  p = this->current_;
  while ('/' < c && c < ':') {
    this->current_ = p;
    if (p < this->end_) {
      c = *p;
      p = p + 1;
    }
    else {
      c = '\0';
    }
  }
  if (c == '.') {
    this->current_ = p;
    if (p < this->end_) {
      c = *p;
      p = p + 1;
    }
    else {
      c = '\0';
    }
    while ('/' < c && c < ':') {
      this->current_ = p;
      if (p < this->end_) {
        c = *p;
        p = p + 1;
      }
      else {
        c = '\0';
      }
    }
  }
  if ((c == 'e') || (c == 'E')) {
    this->current_ = p;
    if (p < this->end_) {
      c = *p;
      p = p + 1;
    }
    else {
      c = '\0';
    }
    if ((c == '+') || (c == '-')) {
      this->current_ = p;
      if (p < this->end_) {
        c = *p;
        p = p + 1;
      }
      else {
        c = '\0';
      }
    }
    while ('/' < c && c < ':') {
      this->current_ = p;
      if (p < this->end_) {
        c = *p;
        p = p + 1;
      }
      else {
        c = '\0';
      }
    }
  }
  return;
}

Assistant:

void OurReader::readNumber() {
  const char *p = current_;
  char c = '0'; // stopgap for already consumed character
  // integral part
  while (c >= '0' && c <= '9')
    c = (current_ = p) < end_ ? *p++ : 0;
  // fractional part
  if (c == '.') {
    c = (current_ = p) < end_ ? *p++ : 0;
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : 0;
  }
  // exponential part
  if (c == 'e' || c == 'E') {
    c = (current_ = p) < end_ ? *p++ : 0;
    if (c == '+' || c == '-')
      c = (current_ = p) < end_ ? *p++ : 0;
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : 0;
  }
}